

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O3

string * __thiscall
bandit::reporter::xunit::escape(string *__return_storage_ptr__,xunit *this,string *str)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  size_type sVar5;
  char *pcVar6;
  stringstream stm;
  byte local_1b9;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      if (bVar1 < 0x3c) {
        if (bVar1 == 0x22) {
          lVar4 = 6;
          pcVar6 = "&quot;";
          goto LAB_0010a3c0;
        }
        if (bVar1 == 0x26) {
          lVar4 = 5;
          pcVar6 = "&amp;";
          goto LAB_0010a3c0;
        }
LAB_0010a3d2:
        local_1b9 = bVar1;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1b9,1);
      }
      else {
        lVar4 = 4;
        if (bVar1 == 0x3c) {
          pcVar6 = "&lt;";
        }
        else if (bVar1 == 0x3e) {
          pcVar6 = "&gt;";
        }
        else {
          if (bVar1 != 0x5c) goto LAB_0010a3d2;
          lVar4 = 6;
          pcVar6 = "&apos;";
        }
LAB_0010a3c0:
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,lVar4);
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string escape(const std::string& str) {
        std::stringstream stm;

        for (char c : str) {
          switch (c) {
          case '&':
            stm << "&amp;";
            break;
          case '<':
            stm << "&lt;";
            break;
          case '>':
            stm << "&gt;";
            break;
          case '\\':
            stm << "&apos;";
            break;
          case '\"':
            stm << "&quot;";
            break;
          default:
            stm << c;
          }
        }

        return stm.str();
      }